

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

size_t jessilib::starts_with_length<char16_t,char32_t>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  size_t sVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  jessilib *this;
  decode_result dVar6;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  size_t local_38;
  
  pcVar1 = (char16_t *)in_prefix._M_len;
  pcVar5 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pcVar4 = (char16_t *)0x0;
  sVar3 = 0;
  pcVar2 = pcVar1;
  while( true ) {
    if ((this == (jessilib *)0x0) || (pcVar1 == pcVar4)) {
      local_38 = 0;
      if (pcVar1 == pcVar4) {
        local_38 = sVar3;
      }
      return local_38;
    }
    in_string_00._M_str = pcVar2;
    in_string_00._M_len = (size_t)pcVar5;
    dVar6 = decode_codepoint_utf16<char16_t>(this,in_string_00);
    pcVar2 = (char16_t *)dVar6.units;
    if (pcVar2 == (char16_t *)0x0) {
      return 0;
    }
    if (dVar6.codepoint != in_prefix._M_str[(long)pcVar4]) break;
    pcVar5 = pcVar5 + (long)pcVar2;
    this = this + -(long)pcVar2;
    sVar3 = sVar3 + (long)pcVar2;
    pcVar4 = (char16_t *)((long)pcVar4 + 1);
  }
  return 0;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}